

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_sched_perf.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  char cVar2;
  ostream *poVar3;
  TaskPool *this;
  Task *task_ptr;
  void *pvVar4;
  long lVar5;
  char *pcVar6;
  size_t ntasks;
  ulong uVar7;
  size_t ntasks_1;
  ulong ntasks_00;
  
  process_arguments(argc,argv);
  depspawn::set_threads(Nthreads);
  if (-1 < Queue_limit) {
    depspawn::set_task_queue_limit(Queue_limit);
  }
  std::vector<double,_std::allocator<double>_>::resize(&TSeq,(long)NReps);
  std::vector<double,_std::allocator<double>_>::resize(&TPar,(long)NReps);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,Nthreads);
  poVar3 = std::operator<<(poVar3," threads max_tile_size=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," NReps=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,NReps);
  poVar3 = std::operator<<(poVar3," ClearCache=");
  cVar2 = 'N';
  if (ClearCaches != false) {
    cVar2 = 'Y';
  }
  poVar3 = std::operator<<(poVar3,cVar2);
  poVar3 = std::operator<<(poVar3," QueueLimit=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,Queue_limit);
  poVar3 = std::operator<<(poVar3," EnqueueTasks=");
  cVar2 = 'N';
  if (depspawn::internal::EnqueueTasks != '\0') {
    cVar2 = 'Y';
  }
  poVar3 = std::operator<<(poVar3,cVar2);
  poVar3 = std::operator<<(poVar3," Baseline=");
  pcVar6 = "Sequential";
  if (ParallelBaseline != false) {
    pcVar6 = "Parallel";
  }
  poVar3 = std::operator<<(poVar3,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"non-");
  std::operator<<(poVar3,"TBB parallel baseline version\n");
  if (OnlyParallelRun == false) {
    this = depspawn::get_task_pool();
    depspawn::internal::TaskPool::launch_threads(this);
    for (lVar5 = 0; lVar5 != 0x4000; lVar5 = lVar5 + 1) {
      task_ptr = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                           (&this->task_pool_);
      *(undefined8 *)&(task_ptr->func_).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(task_ptr->func_).super__Function_base._M_functor + 8) = 0;
      (task_ptr->func_).super__Function_base._M_manager = (_Manager_type)0x0;
      (task_ptr->func_)._M_invoker = (_Invoker_type)0x0;
      pvVar4 = operator_new(0x10);
      *(long *)((long)pvVar4 + 8) = lVar5;
      *(void **)&(task_ptr->func_).super__Function_base._M_functor = pvVar4;
      (task_ptr->func_)._M_invoker =
           std::
           _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fraguela[P]depspawn/tests/bench_sched_perf.cpp:286:23)_(unsigned_long)>_>
           ::_M_invoke;
      (task_ptr->func_).super__Function_base._M_manager =
           std::
           _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fraguela[P]depspawn/tests/bench_sched_perf.cpp:286:23)_(unsigned_long)>_>
           ::_M_manager;
      task_ptr->ctx_ = (Workitem *)0x0;
      task_ptr->next = (Task *)this;
      depspawn::internal::TaskPool::enqueue(this,task_ptr);
    }
    depspawn::internal::TaskPool::wait(this,(void *)0x0);
    bench_parallel_time(MaxNTasks,1);
  }
  std::operator<<((ostream *)&std::cout,"size %");
  for (uVar7 = 0x80; uVar7 <= MaxNTasks; uVar7 = uVar7 * 2) {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 5;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar3,"    ");
  }
  std::operator<<((ostream *)&std::cout,"tasks\n");
  for (uVar7 = 10; uVar7 <= MaxTileSize; uVar7 = uVar7 + 5) {
    if (Verbosity != 0) {
      std::operator<<((ostream *)&std::cout,"Tests for TSZ=");
    }
    lVar5 = std::cout;
    *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xffffff4f |
         0x80;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar5 + -0x18)) = 3;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    poVar3 = std::operator<<(poVar3,' ');
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffff4f | 0x20;
    if (Verbosity != 0) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    cur_tile_sz = uVar7;
    for (ntasks_00 = 0x80; ntasks_00 <= MaxNTasks; ntasks_00 = ntasks_00 * 2) {
      dVar1 = bench_sched_perf(ntasks_00);
      if (Verbosity != 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"TSZ=");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3," NTASKS=");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3," r=");
      }
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 8;
      poVar3 = std::ostream::_M_insert<double>(dVar1);
      std::operator<<(poVar3,' ');
      if (Verbosity != 0) {
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  process_arguments(argc, argv);
  
  //test_TP("before set_threads");
  set_threads(Nthreads);
  //test_TP("after set_threads");
  
  if (Queue_limit >= 0) {
    set_task_queue_limit(Queue_limit);
  }
  
  TSeq.resize(NReps);
  TPar.resize(NReps);

  std::cout << Nthreads << " threads max_tile_size=" << MaxTileSize << " NReps=" << NReps << " ClearCache=" << (ClearCaches ? 'Y' : 'N') << " QueueLimit=" << Queue_limit << " EnqueueTasks=" << (depspawn::internal::EnqueueTasks ? 'Y' : 'N') << " Baseline=" << (ParallelBaseline ? "Parallel" : "Sequential") << std::endl;

  std::cout <<
#ifndef USE_TBB
  "non-" <<
#endif
  "TBB parallel baseline version\n";

  if(!OnlyParallelRun) {
    const auto task = [] (size_t i) { Destination[i].clear(); };

#ifdef USE_TBB
    // This is to try to build the threads before the first test; just in case
    tbb::parallel_for(size_t(0), MAX_NTASKS, task);
#else
    get_task_pool().parallel_for((size_t)0, MAX_NTASKS, (size_t)1, task, false);
//    TP->launch_threads();
//    for (size_t i = 0; i < MAX_NTASKS; i++) {
//      TP->enqueue(task, i);
//    }
//    TP->wait(false);
#endif

    //1-time runtime preheat (for memory pools)
    bench_parallel_time(MaxNTasks, 1);
  }
  
  std::cout << "size %";
  for (size_t ntasks = (1 << 7); ntasks <= MaxNTasks; ntasks *= 2) {
    std::cout << std::setw(5) << ntasks << "    ";
  }
  std::cout << "tasks\n";
  
  for (size_t tile_sz=10; tile_sz <= MaxTileSize; tile_sz += 5) {
    if (Verbosity) {
      std::cout << "Tests for TSZ=";
    }
    std::cout << std::right << std::setw(3) << tile_sz << ' ' << std::left;
    if (Verbosity) {
      std::cout << std::endl;
    }
    cur_tile_sz = tile_sz;
    for (size_t ntasks = (1 << 7); ntasks <= MaxNTasks; ntasks *= 2) {
      const double normalized_par_to_seq_ratio = bench_sched_perf(ntasks);
      if (Verbosity) {
        std::cout << "TSZ=" << tile_sz << " NTASKS=" << ntasks << " r=";
      }
      std::cout << std::setw(8) << normalized_par_to_seq_ratio << ' ';
      if (Verbosity) {
        std::cout << std::endl;
      }
    }
    //std::cout << '%' << tile_sz;
    std::cout << std::endl;
  }
  
  //test_TP("before exiting");
  
  return 0;
}